

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

void printConsistingReads
               (ostream *outfile,deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *reads
               ,double uniqueSupportFilter)

{
  _Elt_pointer ppAVar1;
  pointer pcVar2;
  pointer pbVar3;
  ostream *poVar4;
  pointer pbVar5;
  _Elt_pointer ppAVar6;
  string readName;
  _Map_pointer local_90;
  _Elt_pointer local_88;
  char *local_68;
  long local_60;
  char local_58 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  ppAVar6 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppAVar1 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar6 != ppAVar1) {
    local_88 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_last;
    local_90 = (reads->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if ((uniqueSupportFilter <= -1.0) || (uniqueSupportFilter < (double)(*ppAVar6)->uniqueSupport)
         ) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (outfile,((*ppAVar6)->name)._M_dataplus._M_p,
                            ((*ppAVar6)->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,&(*ppAVar6)->consistingReads);
        pbVar3 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar5 = local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar3;
            pbVar5 = pbVar5 + 1) {
          pcVar2 = (pbVar5->_M_dataplus)._M_p;
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar2,pcVar2 + pbVar5->_M_string_length);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(outfile,local_68,local_60);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," , ",3);
          if (local_68 != local_58) {
            operator_delete(local_68);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        std::ios::widen((char)*(undefined8 *)(*(long *)outfile + -0x18) + (char)outfile);
        std::ostream::put((char)outfile);
        std::ostream::flush();
      }
      ppAVar6 = ppAVar6 + 1;
      if (ppAVar6 == local_88) {
        ppAVar6 = local_90[1];
        local_90 = local_90 + 1;
        local_88 = ppAVar6 + 0x40;
      }
    } while (ppAVar6 != ppAVar1);
  }
  return;
}

Assistant:

int computeRevSOffset(const std::vector<char>& cigar){
    std::vector<char> t = cigar;
    int offset = 0;
    for (std::vector<char>::reverse_iterator it = t.rbegin(); it != t.rend(); ++it){
        if (*it == 'S'){
            offset++;
        } else break;
    }
    return offset;
}